

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall rengine::RectangleNode::setColor(RectangleNode *this,vec4 color)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = 1.0;
  if (color.x <= 1.0) {
    fVar3 = color.x;
  }
  fVar2 = 0.0;
  if (0.0 <= fVar3) {
    fVar2 = fVar3;
  }
  uVar1 = *(undefined8 *)&(this->super_RectangleNodeBase).field_0x44;
  fVar3 = (float)uVar1;
  if ((fVar3 == fVar2) && (!NAN(fVar3) && !NAN(fVar2))) {
    fVar3 = 1.0;
    if (color.y <= 1.0) {
      fVar3 = color.y;
    }
    fVar2 = 0.0;
    if (0.0 <= fVar3) {
      fVar2 = fVar3;
    }
    fVar3 = (float)((ulong)uVar1 >> 0x20);
    if ((fVar3 == fVar2) && (!NAN(fVar3) && !NAN(fVar2))) {
      fVar3 = 1.0;
      if (color.z <= 1.0) {
        fVar3 = color.z;
      }
      fVar2 = 0.0;
      if (0.0 <= fVar3) {
        fVar2 = fVar3;
      }
      fVar3 = (float)*(undefined8 *)&this->field_0x4c;
      if ((fVar3 == fVar2) && (!NAN(fVar3) && !NAN(fVar2))) {
        fVar3 = 1.0;
        if (color.w <= 1.0) {
          fVar3 = color.w;
        }
        fVar2 = 0.0;
        if (0.0 <= fVar3) {
          fVar2 = fVar3;
        }
        fVar3 = (float)((ulong)*(undefined8 *)&this->field_0x4c >> 0x20);
        if ((fVar3 == fVar2) && (!NAN(fVar3) && !NAN(fVar2))) {
          return;
        }
      }
    }
  }
  *(vec4 *)&(this->super_RectangleNodeBase).field_0x44 = color;
  Signal<>::emit(&onColorChanged,(SignalEmitter *)this);
  return;
}

Assistant:

void setColor(vec4 color) {
        vec4 c = color;
        c.x = std::max(std::min(c.x, 1.0f), 0.0f);
        c.y = std::max(std::min(c.y, 1.0f), 0.0f);
        c.z = std::max(std::min(c.z, 1.0f), 0.0f);
        c.w = std::max(std::min(c.w, 1.0f), 0.0f);
        if (c == m_color)
            return;
        m_color = color;
        onColorChanged.emit(this);
    }